

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientKeepAlive.cpp
# Opt level: O0

void __thiscall
ki::protocol::control::ClientKeepAlive::write_to(ClientKeepAlive *this,ostream *ostream)

{
  Field<unsigned_short> *pFVar1;
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [55];
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  Record record;
  ostream *ostream_local;
  ClientKeepAlive *this_local;
  
  record.m_field_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)ostream;
  ki::dml::Record::Record((Record *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"m_session_id",&local_89);
  pFVar1 = ki::dml::Record::add_field<unsigned_short>((Record *)local_68,(string *)local_88,true);
  ki::dml::Field<unsigned_short>::set_value(pFVar1,this->m_session_id);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"m_milliseconds",&local_c1);
  pFVar1 = ki::dml::Record::add_field<unsigned_short>((Record *)local_68,(string *)local_c0,true);
  ki::dml::Field<unsigned_short>::set_value(pFVar1,this->m_milliseconds);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"m_minutes",&local_e9);
  pFVar1 = ki::dml::Record::add_field<unsigned_short>((Record *)local_68,(string *)local_e8,true);
  ki::dml::Field<unsigned_short>::set_value(pFVar1,this->m_minutes);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  ki::dml::Record::write_to
            ((Record *)local_68,
             (ostream *)record.m_field_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ki::dml::Record::~Record((Record *)local_68);
  return;
}

Assistant:

void ClientKeepAlive::write_to(std::ostream &ostream) const
	{
		dml::Record record;
		record.add_field<dml::USHRT>("m_session_id")->set_value(m_session_id);
		record.add_field<dml::USHRT>("m_milliseconds")->set_value(m_milliseconds);
		record.add_field<dml::USHRT>("m_minutes")->set_value(m_minutes);
		record.write_to(ostream);
	}